

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::compact(UnicodeSet *this)

{
  UBool UVar1;
  UChar32 *pUVar2;
  int iVar3;
  UChar32 *temp;
  int32_t newCapacity;
  UnicodeSet *this_local;
  
  UVar1 = isFrozen(this);
  if ((UVar1 == '\0') && (UVar1 = isBogus(this), UVar1 == '\0')) {
    if (this->buffer != (UChar32 *)0x0) {
      uprv_free_63(this->buffer);
      this->buffer = (UChar32 *)0x0;
    }
    if (this->len < this->capacity) {
      iVar3 = this->len + (uint)(this->len == 0);
      pUVar2 = (UChar32 *)uprv_realloc_63(this->list,(long)iVar3 << 2);
      if (pUVar2 != (UChar32 *)0x0) {
        this->list = pUVar2;
        this->capacity = iVar3;
      }
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::compact() {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    // Delete buffer first to defragment memory less.
    if (buffer != NULL) {
        uprv_free(buffer);
        buffer = NULL;
    }
    if (len < capacity) {
        // Make the capacity equal to len or 1.
        // We don't want to realloc of 0 size.
        int32_t newCapacity = len + (len == 0);
        UChar32* temp = (UChar32*) uprv_realloc(list, sizeof(UChar32) * newCapacity);
        if (temp) {
            list = temp;
            capacity = newCapacity;
        }
        // else what the heck happened?! We allocated less memory!
        // Oh well. We'll keep our original array.
    }
    return *this;
}